

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

void rand_nonzero(uint8_t *out,size_t len)

{
  int iVar1;
  ulong local_20;
  size_t i;
  size_t len_local;
  uint8_t *out_local;
  
  RAND_bytes(out,(int)len);
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    while (iVar1 = constant_time_declassify_int((uint)(out[local_20] == '\0')), iVar1 != 0) {
      RAND_bytes(out + local_20,1);
    }
  }
  return;
}

Assistant:

static void rand_nonzero(uint8_t *out, size_t len) {
  RAND_bytes(out, len);

  for (size_t i = 0; i < len; i++) {
    // Zero values are replaced, and the distribution of zero and non-zero bytes
    // is public, so leaking this is safe.
    while (constant_time_declassify_int(out[i] == 0)) {
      RAND_bytes(out + i, 1);
    }
  }
}